

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# importer.cc
# Opt level: O1

bool google::protobuf::compiler::ApplyMapping
               (string *filename,string *old_prefix,string *new_prefix,string *result)

{
  pointer pcVar1;
  ulong uVar2;
  pointer __s2;
  size_t sVar3;
  size_type sVar4;
  short *psVar5;
  char *pcVar6;
  short *psVar7;
  int iVar8;
  int iVar9;
  long lVar10;
  byte bVar11;
  bool bVar12;
  string after_prefix;
  short *local_50;
  ulong local_48;
  short local_40 [8];
  
  if (old_prefix->_M_string_length == 0) {
    iVar8 = std::__cxx11::string::compare((char *)filename);
    if (iVar8 != 0) {
      psVar5 = (short *)(filename->_M_dataplus)._M_p;
      uVar2 = filename->_M_string_length;
      if ((long)uVar2 < 0) {
        stringpiece_internal::StringPiece::LogFatalSizeTooBig
                  (uVar2,"string length exceeds max size");
      }
      if ((uVar2 < 3) || ((char)psVar5[1] != '/' || *psVar5 != 0x2e2e)) {
        pcVar1 = (filename->_M_dataplus)._M_p;
        uVar2 = filename->_M_string_length;
        if ((long)uVar2 < 0) {
          stringpiece_internal::StringPiece::LogFatalSizeTooBig
                    (uVar2,"string length exceeds max size");
        }
        if ((uVar2 < 3) || (pcVar1[uVar2 - 1] != '.' || *(short *)(pcVar1 + (uVar2 - 3)) != 0x2e2f))
        {
          bVar11 = 0;
          lVar10 = std::__cxx11::string::find((char *)filename,0x43e172,0);
          if (lVar10 != -1) goto LAB_0033e166;
          pcVar6 = (filename->_M_dataplus)._M_p;
          sVar3 = filename->_M_string_length;
          if ((long)sVar3 < 0) {
            stringpiece_internal::StringPiece::LogFatalSizeTooBig
                      (sVar3,"string length exceeds max size");
          }
          if ((sVar3 == 0) || (*pcVar6 != '/')) {
            std::__cxx11::string::_M_assign((string *)result);
            if (result->_M_string_length != 0) {
              std::__cxx11::string::push_back((char)result);
            }
            std::__cxx11::string::_M_append((char *)result,(ulong)(filename->_M_dataplus)._M_p);
            goto LAB_0033e01f;
          }
        }
      }
    }
  }
  else {
    pcVar1 = (filename->_M_dataplus)._M_p;
    uVar2 = filename->_M_string_length;
    if ((long)uVar2 < 0) {
      stringpiece_internal::StringPiece::LogFatalSizeTooBig(uVar2,"string length exceeds max size");
    }
    __s2 = (old_prefix->_M_dataplus)._M_p;
    sVar3 = old_prefix->_M_string_length;
    if ((long)sVar3 < 0) {
      stringpiece_internal::StringPiece::LogFatalSizeTooBig(sVar3,"string length exceeds max size");
    }
    if ((sVar3 <= uVar2) && (iVar8 = bcmp(pcVar1,__s2,sVar3), iVar8 == 0)) {
      sVar4 = old_prefix->_M_string_length;
      if (filename->_M_string_length == sVar4) {
        std::__cxx11::string::_M_assign((string *)result);
LAB_0033e01f:
        bVar11 = 1;
        goto LAB_0033e166;
      }
      pcVar1 = (filename->_M_dataplus)._M_p;
      if (pcVar1[sVar4] == '/') {
        iVar8 = (int)sVar4 + 1;
      }
      else {
        iVar8 = -1;
        if (pcVar1[sVar4 - 1] == '/') {
          iVar8 = (int)sVar4;
        }
      }
      if (iVar8 != -1) {
        std::__cxx11::string::substr((ulong)&local_50,(ulong)filename);
        iVar9 = std::__cxx11::string::compare((char *)&local_50);
        uVar2 = local_48;
        psVar5 = local_50;
        bVar12 = true;
        if (iVar9 != 0) {
          if ((long)local_48 < 0) {
            stringpiece_internal::StringPiece::LogFatalSizeTooBig
                      (local_48,"string length exceeds max size");
          }
          psVar7 = local_50;
          if ((uVar2 < 3) || ((char)psVar5[1] != '/' || *psVar5 != 0x2e2e)) {
            if ((long)local_48 < 0) {
              stringpiece_internal::StringPiece::LogFatalSizeTooBig
                        (local_48,"string length exceeds max size");
            }
            if ((local_48 < 3) ||
               (*(char *)((long)psVar7 + (local_48 - 1)) != '.' ||
                *(short *)((long)psVar7 + (local_48 - 3)) != 0x2e2f)) {
              lVar10 = std::__cxx11::string::find((char *)&local_50,0x43e172,0);
              bVar12 = lVar10 != -1;
            }
          }
        }
        if (bVar12 == false) {
          std::__cxx11::string::_M_assign((string *)result);
          if (result->_M_string_length != 0) {
            std::__cxx11::string::push_back((char)result);
          }
          std::__cxx11::string::_M_append((char *)result,(ulong)local_50);
        }
        if (local_50 != local_40) {
          operator_delete(local_50);
        }
        old_prefix = (string *)(ulong)(bVar12 ^ 1);
      }
      bVar11 = (byte)old_prefix;
      if (iVar8 != -1) goto LAB_0033e166;
    }
  }
  bVar11 = 0;
LAB_0033e166:
  return (bool)(bVar11 & 1);
}

Assistant:

static bool ApplyMapping(const std::string& filename,
                         const std::string& old_prefix,
                         const std::string& new_prefix, std::string* result) {
  if (old_prefix.empty()) {
    // old_prefix matches any relative path.
    if (ContainsParentReference(filename)) {
      // We do not allow the file name to use "..".
      return false;
    }
    if (HasPrefixString(filename, "/") || IsWindowsAbsolutePath(filename)) {
      // This is an absolute path, so it isn't matched by the empty string.
      return false;
    }
    result->assign(new_prefix);
    if (!result->empty()) result->push_back('/');
    result->append(filename);
    return true;
  } else if (HasPrefixString(filename, old_prefix)) {
    // old_prefix is a prefix of the filename.  Is it the whole filename?
    if (filename.size() == old_prefix.size()) {
      // Yep, it's an exact match.
      *result = new_prefix;
      return true;
    } else {
      // Not an exact match.  Is the next character a '/'?  Otherwise,
      // this isn't actually a match at all.  E.g. the prefix "foo/bar"
      // does not match the filename "foo/barbaz".
      int after_prefix_start = -1;
      if (filename[old_prefix.size()] == '/') {
        after_prefix_start = old_prefix.size() + 1;
      } else if (filename[old_prefix.size() - 1] == '/') {
        // old_prefix is never empty, and canonicalized paths never have
        // consecutive '/' characters.
        after_prefix_start = old_prefix.size();
      }
      if (after_prefix_start != -1) {
        // Yep.  So the prefixes are directories and the filename is a file
        // inside them.
        std::string after_prefix = filename.substr(after_prefix_start);
        if (ContainsParentReference(after_prefix)) {
          // We do not allow the file name to use "..".
          return false;
        }
        result->assign(new_prefix);
        if (!result->empty()) result->push_back('/');
        result->append(after_prefix);
        return true;
      }
    }
  }

  return false;
}